

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_location_handler.c
# Opt level: O1

_Bool cio_http_location_handler_no_callbacks(cio_http_location_handler *handler)

{
  if ((((((handler->on_url == (cio_http_data_cb_t)0x0) &&
         (handler->on_headers_complete == (cio_http_cb_t)0x0)) &&
        (handler->on_message_complete == (cio_http_cb_t)0x0)) &&
       ((handler->on_header_field_name == (cio_http_data_cb_t)0x0 &&
        (handler->on_header_field_value == (cio_http_data_cb_t)0x0)))) &&
      ((handler->on_body == (cio_http_data_cb_t)0x0 &&
       ((handler->on_port == (cio_http_data_cb_t)0x0 &&
        (handler->on_host == (cio_http_data_cb_t)0x0)))))) &&
     ((handler->on_path == (cio_http_data_cb_t)0x0 &&
      ((handler->on_query == (cio_http_data_cb_t)0x0 &&
       (handler->on_schema == (cio_http_data_cb_t)0x0)))))) {
    return handler->on_fragment == (cio_http_data_cb_t)0x0;
  }
  return false;
}

Assistant:

bool cio_http_location_handler_no_callbacks(const struct cio_http_location_handler *handler)
{
	if (handler->on_url ||
	    handler->on_headers_complete ||
	    handler->on_message_complete ||
	    handler->on_header_field_name ||
	    handler->on_header_field_value ||
	    handler->on_body ||
	    handler->on_port ||
	    handler->on_host ||
	    handler->on_path ||
	    handler->on_query ||
	    handler->on_schema ||
	    handler->on_fragment) {
		return false;
	}

	return true;
}